

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

DeviceBuilder * __thiscall
vkb::DeviceBuilder::custom_queue_setup
          (DeviceBuilder *this,
          vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
          *queue_descriptions)

{
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
  *queue_descriptions_local;
  DeviceBuilder *this_local;
  
  std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::operator=
            (&(this->info).queue_descriptions,queue_descriptions);
  return this;
}

Assistant:

DeviceBuilder& DeviceBuilder::custom_queue_setup(std::vector<CustomQueueDescription> queue_descriptions) {
    info.queue_descriptions = std::move(queue_descriptions);
    return *this;
}